

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactTriangleXYZ::ComputeJacobianForContactPart
          (ChContactTriangleXYZ *this,ChVector<double> *abs_point,ChMatrix33<double> *contact_plane,
          type_constraint_tuple *jacobian_tuple_N,type_constraint_tuple *jacobian_tuple_U,
          type_constraint_tuple *jacobian_tuple_V,bool second)

{
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars1> *__dest;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars1> *__dest_00;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars1> *__dest_01;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars2> *__dest_02;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars2> *__dest_03;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars2> *__dest_04;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars3> *__dest_05;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars3> *__dest_06;
  double *pdVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  type_constraint_tuple *ptVar21;
  type_constraint_tuple *ptVar22;
  type_constraint_tuple *ptVar23;
  type_constraint_tuple *ptVar24;
  type_constraint_tuple *ptVar25;
  undefined4 uVar26;
  ulong uVar27;
  void *pvVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  Index alignedEnd_5;
  ulong uVar32;
  Index alignedEnd_7;
  ulong uVar33;
  Index alignedEnd_2;
  Index alignedEnd_1;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  Index alignedEnd_6;
  Index alignedEnd;
  bool is_into;
  type_constraint_tuple *local_e8;
  type_constraint_tuple *local_e0;
  type_constraint_tuple *local_d8;
  undefined4 local_cc;
  ChMatrix33<double> Jx1;
  double s3;
  double s2;
  double local_68;
  undefined8 uStack_60;
  ChVector<double> p_projected;
  ChMatrix33<double> *local_38;
  
  p_projected.m_data[2] = 0.0;
  p_projected.m_data[0] = 0.0;
  p_projected.m_data[1] = 0.0;
  peVar2 = (this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = (this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  peVar3 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_01 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  peVar4 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_02 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
  }
  local_e0 = jacobian_tuple_V;
  collision::utils::PointTriangleDistance
            (abs_point,(ChVector<double> *)&(peVar2->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)&(peVar3->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)&(peVar4->super_ChNodeFEAbase).field_0x20,&s2,&s3,&is_into,
             &p_projected);
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_68 = (1.0 - s2) - s3;
  uStack_60 = 0;
  local_38 = contact_plane;
  ChMatrix33<double>::ChMatrix33<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
            (&Jx1,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_38)
  ;
  if (!second) {
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar47._0_8_ =
         -Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar47._8_8_ = 0x8000000000000000;
    Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         (double)vmovlpd_avx(auVar47);
  }
  __dest = &jacobian_tuple_N->Cq_1;
  uVar31 = -((uint)((ulong)__dest >> 3) & 0x1fffffff) & 7;
  uVar34 = (ulong)uVar31;
  uVar35 = 3;
  if (uVar34 < 3) {
    uVar35 = uVar34;
  }
  if (uVar31 == 0) {
LAB_00628a8b:
    uVar27 = (ulong)(uint)((int)uVar35 * 8);
    memcpy((void *)((long)(jacobian_tuple_N->Cq_1).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar27),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar27),0x18 - uVar27);
    bVar8 = false;
  }
  else {
    memcpy(__dest,&Jx1,(ulong)(uint)((int)uVar35 * 8));
    bVar8 = true;
    if (uVar31 < 3) goto LAB_00628a8b;
  }
  __dest_00 = &jacobian_tuple_U->Cq_1;
  uVar31 = -((uint)((ulong)__dest_00 >> 3) & 0x1fffffff) & 7;
  uVar32 = (ulong)uVar31;
  uVar27 = 3;
  if (uVar32 < 3) {
    uVar27 = uVar32;
  }
  local_e8 = jacobian_tuple_N;
  if (uVar31 == 0) {
LAB_00628aff:
    uVar29 = (ulong)(uint)((int)uVar27 * 8);
    memcpy((void *)((long)(jacobian_tuple_U->Cq_1).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar29),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar29 + 0x18),0x18 - uVar29);
    local_cc = 0;
  }
  else {
    pvVar28 = memcpy(__dest_00,
                     Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array + 3,(ulong)(uint)((int)uVar27 * 8));
    local_cc = (undefined4)CONCAT71((int7)((ulong)pvVar28 >> 8),1);
    if (uVar31 < 3) goto LAB_00628aff;
  }
  ptVar23 = local_e0;
  __dest_01 = &local_e0->Cq_1;
  uVar31 = -((uint)((ulong)__dest_01 >> 3) & 0x1fffffff) & 7;
  uVar33 = (ulong)uVar31;
  uVar29 = 3;
  if (uVar33 < 3) {
    uVar29 = uVar33;
  }
  local_d8 = jacobian_tuple_U;
  if (uVar31 == 0) {
LAB_00628b70:
    uVar30 = (ulong)(uint)((int)uVar29 * 8);
    memcpy((void *)((long)(local_e0->Cq_1).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar30),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar30 + 0x30),0x18 - uVar30);
    bVar9 = false;
  }
  else {
    memcpy(__dest_01,
           Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 6,
           (ulong)(uint)((int)uVar29 * 8));
    bVar9 = true;
    if (uVar31 < 3) goto LAB_00628b70;
  }
  ptVar21 = local_e8;
  auVar20._8_8_ = uStack_60;
  auVar20._0_8_ = local_68;
  if (uVar34 != 0) {
    auVar36 = vpbroadcastq_avx512vl();
    uVar34 = vpcmpuq_avx512vl(auVar36,_DAT_00955380,5);
    uVar34 = uVar34 & 0xf;
    dVar14 = (jacobian_tuple_N->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[1];
    dVar15 = (jacobian_tuple_N->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[2];
    dVar16 = (jacobian_tuple_N->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[0];
    dVar17 = (jacobian_tuple_N->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[1];
    dVar18 = (jacobian_tuple_N->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[2];
    dVar19 = (jacobian_tuple_N->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[0];
    bVar5 = (bool)((byte)uVar34 & 1);
    bVar6 = (bool)((byte)(uVar34 >> 1) & 1);
    bVar7 = (bool)((byte)(uVar34 >> 2) & 1);
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[0]
         = (double)((ulong)bVar5 *
                    (long)(local_68 *
                          (__dest->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[0]) |
                   (ulong)!bVar5 *
                   (long)(__dest->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                         m_storage.m_data.array[0]);
    (jacobian_tuple_N->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
    m_data.array[1] =
         (double)((ulong)bVar6 * (long)(local_68 * dVar14) | (ulong)!bVar6 * (long)dVar17);
    (jacobian_tuple_N->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
    m_data.array[2] =
         (double)((ulong)bVar7 * (long)(local_68 * dVar15) | (ulong)!bVar7 * (long)dVar18);
    (jacobian_tuple_N->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
    m_data.array[0] =
         (double)((uVar34 >> 3) * (long)(local_68 * dVar16) |
                 (ulong)!SUB81(uVar34 >> 3,0) * (long)dVar19);
  }
  if (!bVar8) {
    auVar37 = vbroadcastsd_avx512f(auVar20);
    auVar38 = vpbroadcastq_avx512f();
    uVar34 = vpcmpuq_avx512f(auVar38,_DAT_00970440,5);
    pdVar1 = (__dest->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
             .array + uVar35;
    auVar38._8_8_ = (ulong)((byte)(uVar34 >> 1) & 1) * (long)pdVar1[1];
    auVar38._0_8_ = (ulong)((byte)uVar34 & 1) * (long)*pdVar1;
    auVar38._16_8_ = (ulong)((byte)(uVar34 >> 2) & 1) * (long)pdVar1[2];
    auVar38._24_8_ = (ulong)((byte)(uVar34 >> 3) & 1) * (long)pdVar1[3];
    auVar38._32_8_ = (ulong)((byte)(uVar34 >> 4) & 1) * (long)pdVar1[4];
    auVar38._40_8_ = (ulong)((byte)(uVar34 >> 5) & 1) * (long)pdVar1[5];
    auVar38._48_8_ = (ulong)((byte)(uVar34 >> 6) & 1) * (long)pdVar1[6];
    auVar38._56_8_ = (uVar34 >> 7) * (long)pdVar1[7];
    auVar37 = vmulpd_avx512f(auVar37,auVar38);
    pdVar1 = (__dest->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data
             .array + uVar35;
    bVar8 = (bool)((byte)uVar34 & 1);
    bVar5 = (bool)((byte)(uVar34 >> 1) & 1);
    bVar6 = (bool)((byte)(uVar34 >> 2) & 1);
    bVar7 = (bool)((byte)(uVar34 >> 3) & 1);
    bVar10 = (bool)((byte)(uVar34 >> 4) & 1);
    bVar11 = (bool)((byte)(uVar34 >> 5) & 1);
    bVar12 = (bool)((byte)(uVar34 >> 6) & 1);
    *pdVar1 = (double)((ulong)bVar8 * auVar37._0_8_ | (ulong)!bVar8 * (long)*pdVar1);
    pdVar1[1] = (double)((ulong)bVar5 * auVar37._8_8_ | (ulong)!bVar5 * (long)pdVar1[1]);
    pdVar1[2] = (double)((ulong)bVar6 * auVar37._16_8_ | (ulong)!bVar6 * (long)pdVar1[2]);
    pdVar1[3] = (double)((ulong)bVar7 * auVar37._24_8_ | (ulong)!bVar7 * (long)pdVar1[3]);
    pdVar1[4] = (double)((ulong)bVar10 * auVar37._32_8_ | (ulong)!bVar10 * (long)pdVar1[4]);
    pdVar1[5] = (double)((ulong)bVar11 * auVar37._40_8_ | (ulong)!bVar11 * (long)pdVar1[5]);
    pdVar1[6] = (double)((ulong)bVar12 * auVar37._48_8_ | (ulong)!bVar12 * (long)pdVar1[6]);
    pdVar1[7] = (double)((uVar34 >> 7) * auVar37._56_8_ |
                        (ulong)!SUB81(uVar34 >> 7,0) * (long)pdVar1[7]);
  }
  if (uVar32 != 0) {
    auVar36 = vpbroadcastq_avx512vl();
    uVar35 = vpcmpuq_avx512vl(auVar36,_DAT_00955380,5);
    uVar35 = uVar35 & 0xf;
    dVar14 = (jacobian_tuple_U->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[1];
    dVar15 = (jacobian_tuple_U->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[2];
    dVar16 = (jacobian_tuple_U->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[0];
    dVar17 = (jacobian_tuple_U->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[1];
    dVar18 = (jacobian_tuple_U->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[2];
    dVar19 = (jacobian_tuple_U->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage.m_data.array[0];
    bVar8 = (bool)((byte)uVar35 & 1);
    bVar5 = (bool)((byte)(uVar35 >> 1) & 1);
    bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
    (__dest_00->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
    [0] = (double)((ulong)bVar8 *
                   (long)(local_68 *
                         (__dest_00->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                         m_storage.m_data.array[0]) |
                  (ulong)!bVar8 *
                  (long)(__dest_00->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                        m_storage.m_data.array[0]);
    (jacobian_tuple_U->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
    m_data.array[1] =
         (double)((ulong)bVar5 * (long)(local_68 * dVar14) | (ulong)!bVar5 * (long)dVar17);
    (jacobian_tuple_U->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
    m_data.array[2] =
         (double)((ulong)bVar6 * (long)(local_68 * dVar15) | (ulong)!bVar6 * (long)dVar18);
    (jacobian_tuple_U->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
    m_data.array[0] =
         (double)((uVar35 >> 3) * (long)(local_68 * dVar16) |
                 (ulong)!SUB81(uVar35 >> 3,0) * (long)dVar19);
  }
  if ((char)local_cc == '\0') {
    auVar37 = vbroadcastsd_avx512f(auVar20);
    auVar38 = vpbroadcastq_avx512f();
    uVar35 = vpcmpuq_avx512f(auVar38,_DAT_00970440,5);
    pdVar1 = (__dest_00->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
             m_data.array + uVar27;
    auVar39._8_8_ = (ulong)((byte)(uVar35 >> 1) & 1) * (long)pdVar1[1];
    auVar39._0_8_ = (ulong)((byte)uVar35 & 1) * (long)*pdVar1;
    auVar39._16_8_ = (ulong)((byte)(uVar35 >> 2) & 1) * (long)pdVar1[2];
    auVar39._24_8_ = (ulong)((byte)(uVar35 >> 3) & 1) * (long)pdVar1[3];
    auVar39._32_8_ = (ulong)((byte)(uVar35 >> 4) & 1) * (long)pdVar1[4];
    auVar39._40_8_ = (ulong)((byte)(uVar35 >> 5) & 1) * (long)pdVar1[5];
    auVar39._48_8_ = (ulong)((byte)(uVar35 >> 6) & 1) * (long)pdVar1[6];
    auVar39._56_8_ = (uVar35 >> 7) * (long)pdVar1[7];
    auVar37 = vmulpd_avx512f(auVar37,auVar39);
    pdVar1 = (__dest_00->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
             m_data.array + uVar27;
    bVar8 = (bool)((byte)uVar35 & 1);
    bVar5 = (bool)((byte)(uVar35 >> 1) & 1);
    bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
    bVar7 = (bool)((byte)(uVar35 >> 3) & 1);
    bVar10 = (bool)((byte)(uVar35 >> 4) & 1);
    bVar11 = (bool)((byte)(uVar35 >> 5) & 1);
    bVar12 = (bool)((byte)(uVar35 >> 6) & 1);
    *pdVar1 = (double)((ulong)bVar8 * auVar37._0_8_ | (ulong)!bVar8 * (long)*pdVar1);
    pdVar1[1] = (double)((ulong)bVar5 * auVar37._8_8_ | (ulong)!bVar5 * (long)pdVar1[1]);
    pdVar1[2] = (double)((ulong)bVar6 * auVar37._16_8_ | (ulong)!bVar6 * (long)pdVar1[2]);
    pdVar1[3] = (double)((ulong)bVar7 * auVar37._24_8_ | (ulong)!bVar7 * (long)pdVar1[3]);
    pdVar1[4] = (double)((ulong)bVar10 * auVar37._32_8_ | (ulong)!bVar10 * (long)pdVar1[4]);
    pdVar1[5] = (double)((ulong)bVar11 * auVar37._40_8_ | (ulong)!bVar11 * (long)pdVar1[5]);
    pdVar1[6] = (double)((ulong)bVar12 * auVar37._48_8_ | (ulong)!bVar12 * (long)pdVar1[6]);
    pdVar1[7] = (double)((uVar35 >> 7) * auVar37._56_8_ |
                        (ulong)!SUB81(uVar35 >> 7,0) * (long)pdVar1[7]);
  }
  if (uVar33 != 0) {
    dVar14 = (ptVar23->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[1];
    dVar15 = (ptVar23->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[2];
    dVar16 = (ptVar23->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[0];
    auVar36 = vpbroadcastq_avx512vl();
    uVar35 = vpcmpuq_avx512vl(auVar36,_DAT_00955380,5);
    uVar35 = uVar35 & 0xf;
    dVar17 = (ptVar23->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[1];
    dVar18 = (ptVar23->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[2];
    dVar19 = (ptVar23->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[0];
    bVar8 = (bool)((byte)uVar35 & 1);
    bVar5 = (bool)((byte)(uVar35 >> 1) & 1);
    bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
    (__dest_01->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
    [0] = (double)((ulong)bVar8 *
                   (long)(local_68 *
                         (__dest_01->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                         m_storage.m_data.array[0]) |
                  (ulong)!bVar8 *
                  (long)(__dest_01->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                        m_storage.m_data.array[0]);
    (ptVar23->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[1] = (double)((ulong)bVar5 * (long)(local_68 * dVar14) | (ulong)!bVar5 * (long)dVar17);
    (ptVar23->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[2] = (double)((ulong)bVar6 * (long)(local_68 * dVar15) | (ulong)!bVar6 * (long)dVar18);
    (ptVar23->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[0] = (double)((uVar35 >> 3) * (long)(local_68 * dVar16) |
                       (ulong)!SUB81(uVar35 >> 3,0) * (long)dVar19);
  }
  if (!bVar9) {
    auVar37 = vbroadcastsd_avx512f(auVar20);
    auVar38 = vpbroadcastq_avx512f();
    uVar35 = vpcmpuq_avx512f(auVar38,_DAT_00970440,5);
    pdVar1 = (__dest_01->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
             m_data.array + uVar29;
    auVar40._8_8_ = (ulong)((byte)(uVar35 >> 1) & 1) * (long)pdVar1[1];
    auVar40._0_8_ = (ulong)((byte)uVar35 & 1) * (long)*pdVar1;
    auVar40._16_8_ = (ulong)((byte)(uVar35 >> 2) & 1) * (long)pdVar1[2];
    auVar40._24_8_ = (ulong)((byte)(uVar35 >> 3) & 1) * (long)pdVar1[3];
    auVar40._32_8_ = (ulong)((byte)(uVar35 >> 4) & 1) * (long)pdVar1[4];
    auVar40._40_8_ = (ulong)((byte)(uVar35 >> 5) & 1) * (long)pdVar1[5];
    auVar40._48_8_ = (ulong)((byte)(uVar35 >> 6) & 1) * (long)pdVar1[6];
    auVar40._56_8_ = (uVar35 >> 7) * (long)pdVar1[7];
    auVar37 = vmulpd_avx512f(auVar37,auVar40);
    pdVar1 = (__dest_01->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
             m_data.array + uVar29;
    bVar8 = (bool)((byte)uVar35 & 1);
    bVar9 = (bool)((byte)(uVar35 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar35 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar35 >> 3) & 1);
    bVar7 = (bool)((byte)(uVar35 >> 4) & 1);
    bVar10 = (bool)((byte)(uVar35 >> 5) & 1);
    bVar11 = (bool)((byte)(uVar35 >> 6) & 1);
    *pdVar1 = (double)((ulong)bVar8 * auVar37._0_8_ | (ulong)!bVar8 * (long)*pdVar1);
    pdVar1[1] = (double)((ulong)bVar9 * auVar37._8_8_ | (ulong)!bVar9 * (long)pdVar1[1]);
    pdVar1[2] = (double)((ulong)bVar5 * auVar37._16_8_ | (ulong)!bVar5 * (long)pdVar1[2]);
    pdVar1[3] = (double)((ulong)bVar6 * auVar37._24_8_ | (ulong)!bVar6 * (long)pdVar1[3]);
    pdVar1[4] = (double)((ulong)bVar7 * auVar37._32_8_ | (ulong)!bVar7 * (long)pdVar1[4]);
    pdVar1[5] = (double)((ulong)bVar10 * auVar37._40_8_ | (ulong)!bVar10 * (long)pdVar1[5]);
    pdVar1[6] = (double)((ulong)bVar11 * auVar37._48_8_ | (ulong)!bVar11 * (long)pdVar1[6]);
    pdVar1[7] = (double)((uVar35 >> 7) * auVar37._56_8_ |
                        (ulong)!SUB81(uVar35 >> 7,0) * (long)pdVar1[7]);
  }
  __dest_02 = &local_e8->Cq_2;
  uVar31 = -((uint)((ulong)__dest_02 >> 3) & 0x1fffffff) & 7;
  uVar34 = (ulong)uVar31;
  uVar35 = 3;
  if (uVar34 < 3) {
    uVar35 = uVar34;
  }
  if (uVar31 == 0) {
LAB_00628d2a:
    uVar27 = (ulong)(uint)((int)uVar35 * 8);
    memcpy((void *)((long)(ptVar21->Cq_2).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar27),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar27),0x18 - uVar27);
    uVar26 = 0;
  }
  else {
    pvVar28 = memcpy(__dest_02,&Jx1,(ulong)(uint)((int)uVar35 * 8));
    uVar26 = (undefined4)CONCAT71((int7)((ulong)pvVar28 >> 8),1);
    if (uVar31 < 3) goto LAB_00628d2a;
  }
  ptVar23 = local_d8;
  __dest_03 = &local_d8->Cq_2;
  uVar31 = -((uint)((ulong)__dest_03 >> 3) & 0x1fffffff) & 7;
  uVar32 = (ulong)uVar31;
  uVar27 = 3;
  if (uVar32 < 3) {
    uVar27 = uVar32;
  }
  local_68._0_4_ = uVar26;
  if (uVar31 == 0) {
LAB_00628da4:
    uVar29 = (ulong)(uint)((int)uVar27 * 8);
    memcpy((void *)((long)(local_d8->Cq_2).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar29),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar29 + 0x18),0x18 - uVar29);
    bVar8 = false;
  }
  else {
    memcpy(__dest_03,
           Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 3,
           (ulong)(uint)((int)uVar27 * 8));
    bVar8 = true;
    if (uVar31 < 3) goto LAB_00628da4;
  }
  ptVar24 = local_e0;
  __dest_04 = &local_e0->Cq_2;
  uVar31 = -((uint)((ulong)__dest_04 >> 3) & 0x1fffffff) & 7;
  uVar33 = (ulong)uVar31;
  uVar29 = 3;
  if (uVar33 < 3) {
    uVar29 = uVar33;
  }
  if (uVar31 == 0) {
LAB_00628e13:
    uVar30 = (ulong)(uint)((int)uVar29 * 8);
    memcpy((void *)((long)(local_e0->Cq_2).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar30),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar30 + 0x30),0x18 - uVar30);
    bVar9 = false;
  }
  else {
    memcpy(__dest_04,
           Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 6,
           (ulong)(uint)((int)uVar29 * 8));
    bVar9 = true;
    if (uVar31 < 3) goto LAB_00628e13;
  }
  ptVar25 = local_d8;
  ptVar22 = local_e8;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = s2;
  if (uVar34 != 0) {
    auVar36 = vpbroadcastq_avx512vl();
    uVar34 = vpcmpuq_avx512vl(auVar36,_DAT_00955380,5);
    uVar34 = uVar34 & 0xf;
    dVar14 = (ptVar21->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[1];
    dVar15 = (ptVar21->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[2];
    dVar16 = (ptVar21->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[0];
    dVar17 = (ptVar21->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[1];
    dVar18 = (ptVar21->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[2];
    dVar19 = (ptVar21->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[0];
    bVar5 = (bool)((byte)uVar34 & 1);
    bVar6 = (bool)((byte)(uVar34 >> 1) & 1);
    bVar7 = (bool)((byte)(uVar34 >> 2) & 1);
    (__dest_02->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
    [0] = (double)((ulong)bVar5 *
                   (long)(s2 * (__dest_02->
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                               m_storage.m_data.array[0]) |
                  (ulong)!bVar5 *
                  (long)(__dest_02->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                        m_storage.m_data.array[0]);
    (ptVar21->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[1] = (double)((ulong)bVar6 * (long)(s2 * dVar14) | (ulong)!bVar6 * (long)dVar17);
    (ptVar21->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[2] = (double)((ulong)bVar7 * (long)(s2 * dVar15) | (ulong)!bVar7 * (long)dVar18);
    (ptVar21->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[0] = (double)((uVar34 >> 3) * (long)(s2 * dVar16) |
                       (ulong)!SUB81(uVar34 >> 3,0) * (long)dVar19);
  }
  if (local_68._0_1_ == '\0') {
    auVar37 = vbroadcastsd_avx512f(auVar48);
    auVar38 = vpbroadcastq_avx512f();
    uVar34 = vpcmpuq_avx512f(auVar38,_DAT_00970440,5);
    pdVar1 = (__dest_02->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
             m_data.array + uVar35;
    auVar41._8_8_ = (ulong)((byte)(uVar34 >> 1) & 1) * (long)pdVar1[1];
    auVar41._0_8_ = (ulong)((byte)uVar34 & 1) * (long)*pdVar1;
    auVar41._16_8_ = (ulong)((byte)(uVar34 >> 2) & 1) * (long)pdVar1[2];
    auVar41._24_8_ = (ulong)((byte)(uVar34 >> 3) & 1) * (long)pdVar1[3];
    auVar41._32_8_ = (ulong)((byte)(uVar34 >> 4) & 1) * (long)pdVar1[4];
    auVar41._40_8_ = (ulong)((byte)(uVar34 >> 5) & 1) * (long)pdVar1[5];
    auVar41._48_8_ = (ulong)((byte)(uVar34 >> 6) & 1) * (long)pdVar1[6];
    auVar41._56_8_ = (uVar34 >> 7) * (long)pdVar1[7];
    auVar37 = vmulpd_avx512f(auVar37,auVar41);
    pdVar1 = (__dest_02->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
             m_data.array + uVar35;
    bVar5 = (bool)((byte)uVar34 & 1);
    bVar6 = (bool)((byte)(uVar34 >> 1) & 1);
    bVar7 = (bool)((byte)(uVar34 >> 2) & 1);
    bVar10 = (bool)((byte)(uVar34 >> 3) & 1);
    bVar11 = (bool)((byte)(uVar34 >> 4) & 1);
    bVar12 = (bool)((byte)(uVar34 >> 5) & 1);
    bVar13 = (bool)((byte)(uVar34 >> 6) & 1);
    *pdVar1 = (double)((ulong)bVar5 * auVar37._0_8_ | (ulong)!bVar5 * (long)*pdVar1);
    pdVar1[1] = (double)((ulong)bVar6 * auVar37._8_8_ | (ulong)!bVar6 * (long)pdVar1[1]);
    pdVar1[2] = (double)((ulong)bVar7 * auVar37._16_8_ | (ulong)!bVar7 * (long)pdVar1[2]);
    pdVar1[3] = (double)((ulong)bVar10 * auVar37._24_8_ | (ulong)!bVar10 * (long)pdVar1[3]);
    pdVar1[4] = (double)((ulong)bVar11 * auVar37._32_8_ | (ulong)!bVar11 * (long)pdVar1[4]);
    pdVar1[5] = (double)((ulong)bVar12 * auVar37._40_8_ | (ulong)!bVar12 * (long)pdVar1[5]);
    pdVar1[6] = (double)((ulong)bVar13 * auVar37._48_8_ | (ulong)!bVar13 * (long)pdVar1[6]);
    pdVar1[7] = (double)((uVar34 >> 7) * auVar37._56_8_ |
                        (ulong)!SUB81(uVar34 >> 7,0) * (long)pdVar1[7]);
  }
  if (uVar32 != 0) {
    auVar36 = vpbroadcastq_avx512vl();
    uVar35 = vpcmpuq_avx512vl(auVar36,_DAT_00955380,5);
    uVar35 = uVar35 & 0xf;
    dVar14 = (ptVar23->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[1];
    dVar15 = (ptVar23->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[2];
    dVar16 = (ptVar23->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[0];
    dVar17 = (ptVar23->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[1];
    dVar18 = (ptVar23->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[2];
    dVar19 = (ptVar23->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[0];
    bVar5 = (bool)((byte)uVar35 & 1);
    bVar6 = (bool)((byte)(uVar35 >> 1) & 1);
    bVar7 = (bool)((byte)(uVar35 >> 2) & 1);
    (__dest_03->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
    [0] = (double)((ulong)bVar5 *
                   (long)(s2 * (__dest_03->
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                               m_storage.m_data.array[0]) |
                  (ulong)!bVar5 *
                  (long)(__dest_03->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                        m_storage.m_data.array[0]);
    (ptVar23->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[1] = (double)((ulong)bVar6 * (long)(s2 * dVar14) | (ulong)!bVar6 * (long)dVar17);
    (ptVar23->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[2] = (double)((ulong)bVar7 * (long)(s2 * dVar15) | (ulong)!bVar7 * (long)dVar18);
    (ptVar23->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[0] = (double)((uVar35 >> 3) * (long)(s2 * dVar16) |
                       (ulong)!SUB81(uVar35 >> 3,0) * (long)dVar19);
  }
  if (!bVar8) {
    auVar37 = vbroadcastsd_avx512f(auVar48);
    auVar38 = vpbroadcastq_avx512f();
    uVar35 = vpcmpuq_avx512f(auVar38,_DAT_00970440,5);
    pdVar1 = (__dest_03->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
             m_data.array + uVar27;
    auVar42._8_8_ = (ulong)((byte)(uVar35 >> 1) & 1) * (long)pdVar1[1];
    auVar42._0_8_ = (ulong)((byte)uVar35 & 1) * (long)*pdVar1;
    auVar42._16_8_ = (ulong)((byte)(uVar35 >> 2) & 1) * (long)pdVar1[2];
    auVar42._24_8_ = (ulong)((byte)(uVar35 >> 3) & 1) * (long)pdVar1[3];
    auVar42._32_8_ = (ulong)((byte)(uVar35 >> 4) & 1) * (long)pdVar1[4];
    auVar42._40_8_ = (ulong)((byte)(uVar35 >> 5) & 1) * (long)pdVar1[5];
    auVar42._48_8_ = (ulong)((byte)(uVar35 >> 6) & 1) * (long)pdVar1[6];
    auVar42._56_8_ = (uVar35 >> 7) * (long)pdVar1[7];
    auVar37 = vmulpd_avx512f(auVar37,auVar42);
    pdVar1 = (__dest_03->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
             m_data.array + uVar27;
    bVar8 = (bool)((byte)uVar35 & 1);
    bVar5 = (bool)((byte)(uVar35 >> 1) & 1);
    bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
    bVar7 = (bool)((byte)(uVar35 >> 3) & 1);
    bVar10 = (bool)((byte)(uVar35 >> 4) & 1);
    bVar11 = (bool)((byte)(uVar35 >> 5) & 1);
    bVar12 = (bool)((byte)(uVar35 >> 6) & 1);
    *pdVar1 = (double)((ulong)bVar8 * auVar37._0_8_ | (ulong)!bVar8 * (long)*pdVar1);
    pdVar1[1] = (double)((ulong)bVar5 * auVar37._8_8_ | (ulong)!bVar5 * (long)pdVar1[1]);
    pdVar1[2] = (double)((ulong)bVar6 * auVar37._16_8_ | (ulong)!bVar6 * (long)pdVar1[2]);
    pdVar1[3] = (double)((ulong)bVar7 * auVar37._24_8_ | (ulong)!bVar7 * (long)pdVar1[3]);
    pdVar1[4] = (double)((ulong)bVar10 * auVar37._32_8_ | (ulong)!bVar10 * (long)pdVar1[4]);
    pdVar1[5] = (double)((ulong)bVar11 * auVar37._40_8_ | (ulong)!bVar11 * (long)pdVar1[5]);
    pdVar1[6] = (double)((ulong)bVar12 * auVar37._48_8_ | (ulong)!bVar12 * (long)pdVar1[6]);
    pdVar1[7] = (double)((uVar35 >> 7) * auVar37._56_8_ |
                        (ulong)!SUB81(uVar35 >> 7,0) * (long)pdVar1[7]);
  }
  if (uVar33 != 0) {
    dVar14 = (ptVar24->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[1];
    dVar15 = (ptVar24->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[2];
    dVar16 = (ptVar24->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[0];
    auVar36 = vpbroadcastq_avx512vl();
    uVar35 = vpcmpuq_avx512vl(auVar36,_DAT_00955380,5);
    uVar35 = uVar35 & 0xf;
    dVar17 = (ptVar24->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[1];
    dVar18 = (ptVar24->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[2];
    dVar19 = (ptVar24->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[0];
    bVar8 = (bool)((byte)uVar35 & 1);
    bVar5 = (bool)((byte)(uVar35 >> 1) & 1);
    bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
    (__dest_04->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
    [0] = (double)((ulong)bVar8 *
                   (long)(s2 * (__dest_04->
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                               m_storage.m_data.array[0]) |
                  (ulong)!bVar8 *
                  (long)(__dest_04->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                        m_storage.m_data.array[0]);
    (ptVar24->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[1] = (double)((ulong)bVar5 * (long)(s2 * dVar14) | (ulong)!bVar5 * (long)dVar17);
    (ptVar24->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[2] = (double)((ulong)bVar6 * (long)(s2 * dVar15) | (ulong)!bVar6 * (long)dVar18);
    (ptVar24->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[0] = (double)((uVar35 >> 3) * (long)(s2 * dVar16) |
                       (ulong)!SUB81(uVar35 >> 3,0) * (long)dVar19);
  }
  if (!bVar9) {
    auVar37 = vbroadcastsd_avx512f(auVar48);
    auVar38 = vpbroadcastq_avx512f();
    uVar35 = vpcmpuq_avx512f(auVar38,_DAT_00970440,5);
    pdVar1 = (__dest_04->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
             m_data.array + uVar29;
    auVar43._8_8_ = (ulong)((byte)(uVar35 >> 1) & 1) * (long)pdVar1[1];
    auVar43._0_8_ = (ulong)((byte)uVar35 & 1) * (long)*pdVar1;
    auVar43._16_8_ = (ulong)((byte)(uVar35 >> 2) & 1) * (long)pdVar1[2];
    auVar43._24_8_ = (ulong)((byte)(uVar35 >> 3) & 1) * (long)pdVar1[3];
    auVar43._32_8_ = (ulong)((byte)(uVar35 >> 4) & 1) * (long)pdVar1[4];
    auVar43._40_8_ = (ulong)((byte)(uVar35 >> 5) & 1) * (long)pdVar1[5];
    auVar43._48_8_ = (ulong)((byte)(uVar35 >> 6) & 1) * (long)pdVar1[6];
    auVar43._56_8_ = (uVar35 >> 7) * (long)pdVar1[7];
    auVar37 = vmulpd_avx512f(auVar37,auVar43);
    pdVar1 = (__dest_04->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
             m_data.array + uVar29;
    bVar8 = (bool)((byte)uVar35 & 1);
    bVar9 = (bool)((byte)(uVar35 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar35 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar35 >> 3) & 1);
    bVar7 = (bool)((byte)(uVar35 >> 4) & 1);
    bVar10 = (bool)((byte)(uVar35 >> 5) & 1);
    bVar11 = (bool)((byte)(uVar35 >> 6) & 1);
    *pdVar1 = (double)((ulong)bVar8 * auVar37._0_8_ | (ulong)!bVar8 * (long)*pdVar1);
    pdVar1[1] = (double)((ulong)bVar9 * auVar37._8_8_ | (ulong)!bVar9 * (long)pdVar1[1]);
    pdVar1[2] = (double)((ulong)bVar5 * auVar37._16_8_ | (ulong)!bVar5 * (long)pdVar1[2]);
    pdVar1[3] = (double)((ulong)bVar6 * auVar37._24_8_ | (ulong)!bVar6 * (long)pdVar1[3]);
    pdVar1[4] = (double)((ulong)bVar7 * auVar37._32_8_ | (ulong)!bVar7 * (long)pdVar1[4]);
    pdVar1[5] = (double)((ulong)bVar10 * auVar37._40_8_ | (ulong)!bVar10 * (long)pdVar1[5]);
    pdVar1[6] = (double)((ulong)bVar11 * auVar37._48_8_ | (ulong)!bVar11 * (long)pdVar1[6]);
    pdVar1[7] = (double)((uVar35 >> 7) * auVar37._56_8_ |
                        (ulong)!SUB81(uVar35 >> 7,0) * (long)pdVar1[7]);
  }
  __dest_05 = &local_e8->Cq_3;
  uVar31 = -((uint)((ulong)__dest_05 >> 3) & 0x1fffffff) & 7;
  uVar34 = (ulong)uVar31;
  uVar35 = 3;
  if (uVar34 < 3) {
    uVar35 = uVar34;
  }
  if (uVar31 == 0) {
LAB_00628fd4:
    uVar27 = (ulong)(uint)((int)uVar35 * 8);
    memcpy((void *)((long)(ptVar22->Cq_3).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar27),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar27),0x18 - uVar27);
    bVar8 = false;
  }
  else {
    memcpy(__dest_05,&Jx1,(ulong)(uint)((int)uVar35 * 8));
    bVar8 = true;
    if (uVar31 < 3) goto LAB_00628fd4;
  }
  local_e8 = (type_constraint_tuple *)&ptVar25->Cq_3;
  uVar31 = -((uint)((ulong)local_e8 >> 3) & 0x1fffffff) & 7;
  uVar32 = (ulong)uVar31;
  uVar27 = 3;
  if (uVar32 < 3) {
    uVar27 = uVar32;
  }
  if (uVar31 == 0) {
LAB_00629046:
    uVar29 = (ulong)(uint)((int)uVar27 * 8);
    memcpy((void *)((long)(ptVar25->Cq_3).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar29),
           (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar29 + 0x18),0x18 - uVar29);
    uVar26 = 0;
  }
  else {
    pvVar28 = memcpy(local_e8,Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array + 3,(ulong)(uint)((int)uVar27 * 8));
    uVar26 = (undefined4)CONCAT71((int7)((ulong)pvVar28 >> 8),1);
    if (uVar31 < 3) goto LAB_00629046;
  }
  ptVar23 = local_e0;
  local_d8 = (type_constraint_tuple *)CONCAT44(local_d8._4_4_,uVar26);
  __dest_06 = &local_e0->Cq_3;
  uVar31 = -((uint)((ulong)__dest_06 >> 3) & 0x1fffffff) & 7;
  uVar33 = (ulong)uVar31;
  uVar29 = 3;
  if (uVar33 < 3) {
    uVar29 = uVar33;
  }
  if (uVar31 != 0) {
    memcpy(__dest_06,
           Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 6,
           (ulong)(uint)((int)uVar29 * 8));
    bVar9 = true;
    if (2 < uVar31) goto LAB_006290d5;
  }
  uVar30 = (ulong)(uint)((int)uVar29 * 8);
  memcpy((void *)((long)(local_e0->Cq_3).
                        super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                        m_data.array + uVar30),
         (void *)((long)Jx1.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + uVar30 + 0x30),0x18 - uVar30);
  bVar9 = false;
LAB_006290d5:
  auVar49._8_8_ = 0;
  auVar49._0_8_ = s3;
  if (uVar34 != 0) {
    auVar36 = vpbroadcastq_avx512vl();
    uVar34 = vpcmpuq_avx512vl(auVar36,_DAT_00955380,5);
    uVar34 = uVar34 & 0xf;
    dVar14 = (ptVar22->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[1];
    dVar15 = (ptVar22->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[2];
    dVar16 = (ptVar22->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[0];
    dVar17 = (ptVar22->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[1];
    dVar18 = (ptVar22->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[2];
    dVar19 = (ptVar22->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[0];
    bVar5 = (bool)((byte)uVar34 & 1);
    bVar6 = (bool)((byte)(uVar34 >> 1) & 1);
    bVar7 = (bool)((byte)(uVar34 >> 2) & 1);
    (__dest_05->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
    [0] = (double)((ulong)bVar5 *
                   (long)(s3 * (__dest_05->
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                               m_storage.m_data.array[0]) |
                  (ulong)!bVar5 *
                  (long)(__dest_05->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                        m_storage.m_data.array[0]);
    (ptVar22->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[1] = (double)((ulong)bVar6 * (long)(s3 * dVar14) | (ulong)!bVar6 * (long)dVar17);
    (ptVar22->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[2] = (double)((ulong)bVar7 * (long)(s3 * dVar15) | (ulong)!bVar7 * (long)dVar18);
    (ptVar22->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = (double)((uVar34 >> 3) * (long)(s3 * dVar16) |
                       (ulong)!SUB81(uVar34 >> 3,0) * (long)dVar19);
  }
  if (!bVar8) {
    auVar37 = vbroadcastsd_avx512f(auVar49);
    auVar38 = vpbroadcastq_avx512f();
    uVar34 = vpcmpuq_avx512f(auVar38,_DAT_00970440,5);
    pdVar1 = (__dest_05->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
             m_data.array + uVar35;
    auVar44._8_8_ = (ulong)((byte)(uVar34 >> 1) & 1) * (long)pdVar1[1];
    auVar44._0_8_ = (ulong)((byte)uVar34 & 1) * (long)*pdVar1;
    auVar44._16_8_ = (ulong)((byte)(uVar34 >> 2) & 1) * (long)pdVar1[2];
    auVar44._24_8_ = (ulong)((byte)(uVar34 >> 3) & 1) * (long)pdVar1[3];
    auVar44._32_8_ = (ulong)((byte)(uVar34 >> 4) & 1) * (long)pdVar1[4];
    auVar44._40_8_ = (ulong)((byte)(uVar34 >> 5) & 1) * (long)pdVar1[5];
    auVar44._48_8_ = (ulong)((byte)(uVar34 >> 6) & 1) * (long)pdVar1[6];
    auVar44._56_8_ = (uVar34 >> 7) * (long)pdVar1[7];
    auVar37 = vmulpd_avx512f(auVar37,auVar44);
    pdVar1 = (__dest_05->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
             m_data.array + uVar35;
    bVar8 = (bool)((byte)uVar34 & 1);
    bVar5 = (bool)((byte)(uVar34 >> 1) & 1);
    bVar6 = (bool)((byte)(uVar34 >> 2) & 1);
    bVar7 = (bool)((byte)(uVar34 >> 3) & 1);
    bVar10 = (bool)((byte)(uVar34 >> 4) & 1);
    bVar11 = (bool)((byte)(uVar34 >> 5) & 1);
    bVar12 = (bool)((byte)(uVar34 >> 6) & 1);
    *pdVar1 = (double)((ulong)bVar8 * auVar37._0_8_ | (ulong)!bVar8 * (long)*pdVar1);
    pdVar1[1] = (double)((ulong)bVar5 * auVar37._8_8_ | (ulong)!bVar5 * (long)pdVar1[1]);
    pdVar1[2] = (double)((ulong)bVar6 * auVar37._16_8_ | (ulong)!bVar6 * (long)pdVar1[2]);
    pdVar1[3] = (double)((ulong)bVar7 * auVar37._24_8_ | (ulong)!bVar7 * (long)pdVar1[3]);
    pdVar1[4] = (double)((ulong)bVar10 * auVar37._32_8_ | (ulong)!bVar10 * (long)pdVar1[4]);
    pdVar1[5] = (double)((ulong)bVar11 * auVar37._40_8_ | (ulong)!bVar11 * (long)pdVar1[5]);
    pdVar1[6] = (double)((ulong)bVar12 * auVar37._48_8_ | (ulong)!bVar12 * (long)pdVar1[6]);
    pdVar1[7] = (double)((uVar34 >> 7) * auVar37._56_8_ |
                        (ulong)!SUB81(uVar34 >> 7,0) * (long)pdVar1[7]);
  }
  if (uVar32 != 0) {
    auVar36 = vpbroadcastq_avx512vl();
    uVar35 = vpcmpuq_avx512vl(auVar36,_DAT_00955380,5);
    uVar35 = uVar35 & 0xf;
    dVar14 = (((PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_e8->variables_1)->
             m_storage).m_data.array[1];
    dVar15 = (((PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_e8->variables_1)->
             m_storage).m_data.array[2];
    dVar16 = (((ChVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars1> *)
              ((long)local_e8 + 0x18))->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
             ).m_storage.m_data.array[0];
    dVar17 = (((PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_e8->variables_1)->
             m_storage).m_data.array[1];
    dVar18 = (((PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_e8->variables_1)->
             m_storage).m_data.array[2];
    dVar19 = (((ChVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars1> *)
              ((long)local_e8 + 0x18))->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
             ).m_storage.m_data.array[0];
    bVar8 = (bool)((byte)uVar35 & 1);
    bVar5 = (bool)((byte)(uVar35 >> 1) & 1);
    bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
    (((PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_e8->variables_1)->m_storage).
    m_data.array[0] =
         (double)((ulong)bVar8 *
                  (long)(s3 * (((PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)
                               &local_e8->variables_1)->m_storage).m_data.array[0]) |
                 (ulong)!bVar8 *
                 (long)(((PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)
                        &local_e8->variables_1)->m_storage).m_data.array[0]);
    (((PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_e8->variables_1)->m_storage).
    m_data.array[1] = (double)((ulong)bVar5 * (long)(s3 * dVar14) | (ulong)!bVar5 * (long)dVar17);
    (((PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_e8->variables_1)->m_storage).
    m_data.array[2] = (double)((ulong)bVar6 * (long)(s3 * dVar15) | (ulong)!bVar6 * (long)dVar18);
    (((ChVectorN<double,_ChVariableTupleCarrier_3vars<3,_3,_3>::nvars1> *)((long)local_e8 + 0x18))->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
         (double)((uVar35 >> 3) * (long)(s3 * dVar16) | (ulong)!SUB81(uVar35 >> 3,0) * (long)dVar19)
    ;
  }
  if ((char)local_d8 == '\0') {
    auVar37 = vbroadcastsd_avx512f(auVar49);
    auVar38 = vpbroadcastq_avx512f();
    uVar35 = vpcmpuq_avx512f(auVar38,_DAT_00970440,5);
    pdVar1 = (((PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_e8->variables_1)->
             m_storage).m_data.array + uVar27;
    auVar45._8_8_ = (ulong)((byte)(uVar35 >> 1) & 1) * (long)pdVar1[1];
    auVar45._0_8_ = (ulong)((byte)uVar35 & 1) * (long)*pdVar1;
    auVar45._16_8_ = (ulong)((byte)(uVar35 >> 2) & 1) * (long)pdVar1[2];
    auVar45._24_8_ = (ulong)((byte)(uVar35 >> 3) & 1) * (long)pdVar1[3];
    auVar45._32_8_ = (ulong)((byte)(uVar35 >> 4) & 1) * (long)pdVar1[4];
    auVar45._40_8_ = (ulong)((byte)(uVar35 >> 5) & 1) * (long)pdVar1[5];
    auVar45._48_8_ = (ulong)((byte)(uVar35 >> 6) & 1) * (long)pdVar1[6];
    auVar45._56_8_ = (uVar35 >> 7) * (long)pdVar1[7];
    auVar37 = vmulpd_avx512f(auVar37,auVar45);
    pdVar1 = (((PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_e8->variables_1)->
             m_storage).m_data.array + uVar27;
    bVar8 = (bool)((byte)uVar35 & 1);
    bVar5 = (bool)((byte)(uVar35 >> 1) & 1);
    bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
    bVar7 = (bool)((byte)(uVar35 >> 3) & 1);
    bVar10 = (bool)((byte)(uVar35 >> 4) & 1);
    bVar11 = (bool)((byte)(uVar35 >> 5) & 1);
    bVar12 = (bool)((byte)(uVar35 >> 6) & 1);
    *pdVar1 = (double)((ulong)bVar8 * auVar37._0_8_ | (ulong)!bVar8 * (long)*pdVar1);
    pdVar1[1] = (double)((ulong)bVar5 * auVar37._8_8_ | (ulong)!bVar5 * (long)pdVar1[1]);
    pdVar1[2] = (double)((ulong)bVar6 * auVar37._16_8_ | (ulong)!bVar6 * (long)pdVar1[2]);
    pdVar1[3] = (double)((ulong)bVar7 * auVar37._24_8_ | (ulong)!bVar7 * (long)pdVar1[3]);
    pdVar1[4] = (double)((ulong)bVar10 * auVar37._32_8_ | (ulong)!bVar10 * (long)pdVar1[4]);
    pdVar1[5] = (double)((ulong)bVar11 * auVar37._40_8_ | (ulong)!bVar11 * (long)pdVar1[5]);
    pdVar1[6] = (double)((ulong)bVar12 * auVar37._48_8_ | (ulong)!bVar12 * (long)pdVar1[6]);
    pdVar1[7] = (double)((uVar35 >> 7) * auVar37._56_8_ |
                        (ulong)!SUB81(uVar35 >> 7,0) * (long)pdVar1[7]);
  }
  if (uVar33 != 0) {
    dVar14 = (ptVar23->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[1];
    dVar15 = (ptVar23->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[2];
    dVar16 = (ptVar23->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[0];
    auVar36 = vpbroadcastq_avx512vl();
    uVar35 = vpcmpuq_avx512vl(auVar36,_DAT_00955380,5);
    uVar35 = uVar35 & 0xf;
    dVar17 = (ptVar23->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[1];
    dVar18 = (ptVar23->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array[2];
    dVar19 = (ptVar23->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[0];
    bVar8 = (bool)((byte)uVar35 & 1);
    bVar5 = (bool)((byte)(uVar35 >> 1) & 1);
    bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
    (__dest_06->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
    [0] = (double)((ulong)bVar8 *
                   (long)(s3 * (__dest_06->
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                               m_storage.m_data.array[0]) |
                  (ulong)!bVar8 *
                  (long)(__dest_06->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                        m_storage.m_data.array[0]);
    (ptVar23->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[1] = (double)((ulong)bVar5 * (long)(s3 * dVar14) | (ulong)!bVar5 * (long)dVar17);
    (ptVar23->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array[2] = (double)((ulong)bVar6 * (long)(s3 * dVar15) | (ulong)!bVar6 * (long)dVar18);
    (ptVar23->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = (double)((uVar35 >> 3) * (long)(s3 * dVar16) |
                       (ulong)!SUB81(uVar35 >> 3,0) * (long)dVar19);
  }
  if (!bVar9) {
    auVar37 = vbroadcastsd_avx512f(auVar49);
    auVar38 = vpbroadcastq_avx512f();
    uVar35 = vpcmpuq_avx512f(auVar38,_DAT_00970440,5);
    pdVar1 = (__dest_06->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
             m_data.array + uVar29;
    auVar46._8_8_ = (ulong)((byte)(uVar35 >> 1) & 1) * (long)pdVar1[1];
    auVar46._0_8_ = (ulong)((byte)uVar35 & 1) * (long)*pdVar1;
    auVar46._16_8_ = (ulong)((byte)(uVar35 >> 2) & 1) * (long)pdVar1[2];
    auVar46._24_8_ = (ulong)((byte)(uVar35 >> 3) & 1) * (long)pdVar1[3];
    auVar46._32_8_ = (ulong)((byte)(uVar35 >> 4) & 1) * (long)pdVar1[4];
    auVar46._40_8_ = (ulong)((byte)(uVar35 >> 5) & 1) * (long)pdVar1[5];
    auVar46._48_8_ = (ulong)((byte)(uVar35 >> 6) & 1) * (long)pdVar1[6];
    auVar46._56_8_ = (uVar35 >> 7) * (long)pdVar1[7];
    auVar37 = vmulpd_avx512f(auVar37,auVar46);
    pdVar1 = (__dest_06->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
             m_data.array + uVar29;
    bVar8 = (bool)((byte)uVar35 & 1);
    bVar9 = (bool)((byte)(uVar35 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar35 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar35 >> 3) & 1);
    bVar7 = (bool)((byte)(uVar35 >> 4) & 1);
    bVar10 = (bool)((byte)(uVar35 >> 5) & 1);
    bVar11 = (bool)((byte)(uVar35 >> 6) & 1);
    *pdVar1 = (double)((ulong)bVar8 * auVar37._0_8_ | (ulong)!bVar8 * (long)*pdVar1);
    pdVar1[1] = (double)((ulong)bVar9 * auVar37._8_8_ | (ulong)!bVar9 * (long)pdVar1[1]);
    pdVar1[2] = (double)((ulong)bVar5 * auVar37._16_8_ | (ulong)!bVar5 * (long)pdVar1[2]);
    pdVar1[3] = (double)((ulong)bVar6 * auVar37._24_8_ | (ulong)!bVar6 * (long)pdVar1[3]);
    pdVar1[4] = (double)((ulong)bVar7 * auVar37._32_8_ | (ulong)!bVar7 * (long)pdVar1[4]);
    pdVar1[5] = (double)((ulong)bVar10 * auVar37._40_8_ | (ulong)!bVar10 * (long)pdVar1[5]);
    pdVar1[6] = (double)((ulong)bVar11 * auVar37._48_8_ | (ulong)!bVar11 * (long)pdVar1[6]);
    pdVar1[7] = (double)((uVar35 >> 7) * auVar37._56_8_ |
                        (ulong)!SUB81(uVar35 >> 7,0) * (long)pdVar1[7]);
  }
  return;
}

Assistant:

void ChContactTriangleXYZ::ComputeJacobianForContactPart(const ChVector<>& abs_point,
                                                         ChMatrix33<>& contact_plane,
                                                         type_constraint_tuple& jacobian_tuple_N,
                                                         type_constraint_tuple& jacobian_tuple_U,
                                                         type_constraint_tuple& jacobian_tuple_V,
                                                         bool second) {
    // compute the triangular area-parameters s1 s2 s3:
    double s2, s3;
    bool is_into;
    ChVector<> p_projected;
    /*double dist =*/collision::utils::PointTriangleDistance(abs_point, GetNode1()->pos, GetNode2()->pos,
                                                             GetNode3()->pos, s2, s3, is_into, p_projected);
    double s1 = 1 - s2 - s3;

    ChMatrix33<> Jx1 = contact_plane.transpose();
    if (!second)
        Jx1 *= -1;

    jacobian_tuple_N.Get_Cq_1().segment(0, 3) = Jx1.row(0);
    jacobian_tuple_U.Get_Cq_1().segment(0, 3) = Jx1.row(1);
    jacobian_tuple_V.Get_Cq_1().segment(0, 3) = Jx1.row(2);
    jacobian_tuple_N.Get_Cq_1() *= s1;
    jacobian_tuple_U.Get_Cq_1() *= s1;
    jacobian_tuple_V.Get_Cq_1() *= s1;
    jacobian_tuple_N.Get_Cq_2().segment(0, 3) = Jx1.row(0);
    jacobian_tuple_U.Get_Cq_2().segment(0, 3) = Jx1.row(1);
    jacobian_tuple_V.Get_Cq_2().segment(0, 3) = Jx1.row(2);
    jacobian_tuple_N.Get_Cq_2() *= s2;
    jacobian_tuple_U.Get_Cq_2() *= s2;
    jacobian_tuple_V.Get_Cq_2() *= s2;
    jacobian_tuple_N.Get_Cq_3().segment(0, 3) = Jx1.row(0);
    jacobian_tuple_U.Get_Cq_3().segment(0, 3) = Jx1.row(1);
    jacobian_tuple_V.Get_Cq_3().segment(0, 3) = Jx1.row(2);
    jacobian_tuple_N.Get_Cq_3() *= s3;
    jacobian_tuple_U.Get_Cq_3() *= s3;
    jacobian_tuple_V.Get_Cq_3() *= s3;
}